

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

Type * slang::ast::UnpackedStructType::fromSyntax(ASTContext *context,StructUnionTypeSyntax *syntax)

{
  undefined1 *puVar1;
  byte *pbVar2;
  pointer ppSVar3;
  TokenKind TVar4;
  StructUnionMemberSyntax *pSVar5;
  SyntaxNode *syntax_00;
  size_t sVar6;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  bool bVar7;
  int iVar8;
  UnpackedStructType *pUVar9;
  DeclaratorSyntax *decl;
  Type *pTVar10;
  uint64_t uVar11;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_01;
  size_t extraout_RDX_02;
  Compilation *pCVar12;
  uint64_t uVar13;
  pointer ppSVar14;
  long lVar15;
  SourceRange sourceRange;
  RandMode local_f0;
  FieldSymbol *field;
  uint64_t bitOffset;
  Compilation *local_d8;
  uint local_cc;
  StructUnionTypeSyntax *local_c8;
  ASTContext *local_c0;
  Scope *local_b8;
  iterator __begin3;
  SourceLocation local_88;
  string_view local_80;
  SmallVector<const_slang::ast::FieldSymbol_*,_5UL> fields;
  
  pCVar12 = ((context->scope).ptr)->compilation;
  fields.super_SmallVectorBase<const_slang::ast::FieldSymbol_*>.data_ =
       (pointer)parsing::Token::location(&syntax->keyword);
  local_d8 = pCVar12;
  local_c0 = context;
  pUVar9 = BumpAllocator::
           emplace<slang::ast::UnpackedStructType,slang::ast::Compilation&,slang::SourceLocation,slang::ast::ASTContext_const&>
                     (&pCVar12->super_BumpAllocator,pCVar12,(SourceLocation *)&fields,context);
  bitOffset = 0;
  fields.super_SmallVectorBase<const_slang::ast::FieldSymbol_*>.data_ =
       (pointer)fields.super_SmallVectorBase<const_slang::ast::FieldSymbol_*>.firstElement;
  fields.super_SmallVectorBase<const_slang::ast::FieldSymbol_*>.len = 0;
  fields.super_SmallVectorBase<const_slang::ast::FieldSymbol_*>.cap = 5;
  ppSVar14 = (syntax->members).
             super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_ptr;
  ppSVar3 = ppSVar14 +
            (syntax->members).
            super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_extent.
            _M_extent_value;
  local_b8 = &pUVar9->super_Scope;
  uVar13 = 0;
  src = extraout_RDX;
  local_c8 = syntax;
  do {
    if (ppSVar14 == ppSVar3) {
      pUVar9->selectableWidth = bitOffset;
      pUVar9->bitstreamWidth = uVar13;
      pCVar12 = local_d8;
      iVar8 = SmallVectorBase<const_slang::ast::FieldSymbol_*>::copy
                        (&fields.super_SmallVectorBase<const_slang::ast::FieldSymbol_*>,
                         (EVP_PKEY_CTX *)local_d8,src);
      (pUVar9->fields)._M_ptr = (pointer)CONCAT44(extraout_var,iVar8);
      (pUVar9->fields)._M_extent._M_extent_value = extraout_RDX_02;
      for (lVar15 = 0; extraout_RDX_02 << 3 != lVar15; lVar15 = lVar15 + 8) {
        DeclaredType::getInitializer
                  ((DeclaredType *)(*(long *)((long)CONCAT44(extraout_var,iVar8) + lVar15) + 0x40));
      }
      (pUVar9->super_Type).super_Symbol.originatingSyntax = (SyntaxNode *)local_c8;
LAB_002315a3:
      SmallVectorBase<const_slang::ast::FieldSymbol_*>::cleanup
                (&fields.super_SmallVectorBase<const_slang::ast::FieldSymbol_*>,
                 (EVP_PKEY_CTX *)pCVar12);
      return &pUVar9->super_Type;
    }
    pSVar5 = *ppSVar14;
    syntax_00 = (pSVar5->super_SyntaxNode).previewNode;
    if (syntax_00 != (SyntaxNode *)0x0) {
      Scope::addMembers(local_b8,syntax_00);
      src = extraout_RDX_00;
    }
    TVar4 = (pSVar5->randomQualifier).kind;
    if (TVar4 == RandCKeyword) {
      local_f0 = RandC;
LAB_002313f7:
      bVar7 = false;
    }
    else {
      if (TVar4 == RandKeyword) {
        local_f0 = Rand;
        goto LAB_002313f7;
      }
      local_f0 = None;
      bVar7 = true;
    }
    __begin3.index = 0;
    sVar6 = (pSVar5->declarators).elements._M_extent._M_extent_value;
    __begin3.list = &pSVar5->declarators;
    for (; (__begin3.list != &pSVar5->declarators || (__begin3.index != sVar6 + 1 >> 1));
        __begin3.index = __begin3.index + 1) {
      decl = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
             iterator_base<slang::syntax::DeclaratorSyntax_*>::dereference(&__begin3);
      local_80 = parsing::Token::valueText(&decl->name);
      local_88 = parsing::Token::location(&decl->name);
      local_cc = (uint)fields.super_SmallVectorBase<const_slang::ast::FieldSymbol_*>.len;
      field = BumpAllocator::
              emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,unsigned_long&,unsigned_int>
                        (&local_d8->super_BumpAllocator,&local_80,&local_88,&bitOffset,&local_cc);
      (field->super_VariableSymbol).super_ValueSymbol.declaredType.typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)(pSVar5->type).ptr;
      puVar1 = &(field->super_VariableSymbol).super_ValueSymbol.declaredType.field_0x3f;
      *puVar1 = *puVar1 & 0x7f;
      ValueSymbol::setFromDeclarator((ValueSymbol *)field,decl);
      syntax_01._M_ptr =
           (pSVar5->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_01._M_extent._M_extent_value =
           (pSVar5->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes((Symbol *)field,(local_c0->scope).ptr,syntax_01);
      field->randMode = local_f0;
      if (!bVar7) {
        pbVar2 = (byte *)((long)&(field->super_VariableSymbol).super_ValueSymbol.declaredType.flags.
                                 m_bits + 1);
        *pbVar2 = *pbVar2 | 2;
      }
      Scope::addMember(local_b8,(Symbol *)field);
      SmallVectorBase<slang::ast::FieldSymbol_const*>::
      emplace_back<slang::ast::FieldSymbol_const*const&>
                ((SmallVectorBase<slang::ast::FieldSymbol_const*> *)&fields,&field);
      pTVar10 = DeclaredType::getType(&(field->super_VariableSymbol).super_ValueSymbol.declaredType)
      ;
      uVar11 = Type::getSelectableWidth(pTVar10);
      bitOffset = bitOffset + uVar11;
      pTVar10 = DeclaredType::getType(&(field->super_VariableSymbol).super_ValueSymbol.declaredType)
      ;
      uVar11 = Type::getBitstreamWidth(pTVar10);
      if ((0x3fffffff8 < bitOffset) || (uVar13 = uVar13 + uVar11, 0x3fffffff8 < uVar13)) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_c8);
        pCVar12 = (Compilation *)0x180009;
        ASTContext::addDiag(local_c0,(DiagCode)0x180009,sourceRange);
        pUVar9 = (UnpackedStructType *)local_d8->errorType;
        goto LAB_002315a3;
      }
      src = extraout_RDX_01;
    }
    ppSVar14 = ppSVar14 + 1;
  } while( true );
}

Assistant:

const Type& UnpackedStructType::fromSyntax(const ASTContext& context,
                                           const StructUnionTypeSyntax& syntax) {
    SLANG_ASSERT(!syntax.packed);

    auto& comp = context.getCompilation();
    auto result = comp.emplace<UnpackedStructType>(comp, syntax.keyword.location(), context);

    uint64_t bitOffset = 0;
    uint64_t bitstreamWidth = 0;
    SmallVector<const FieldSymbol*> fields;
    for (auto member : syntax.members) {
        if (member->previewNode)
            result->addMembers(*member->previewNode);

        RandMode randMode = RandMode::None;
        switch (member->randomQualifier.kind) {
            case TokenKind::RandKeyword:
                randMode = RandMode::Rand;
                break;
            case TokenKind::RandCKeyword:
                randMode = RandMode::RandC;
                break;
            default:
                break;
        }

        for (auto decl : member->declarators) {
            auto field = comp.emplace<FieldSymbol>(decl->name.valueText(), decl->name.location(),
                                                   bitOffset, (uint32_t)fields.size());
            field->setDeclaredType(*member->type);
            field->setFromDeclarator(*decl);
            field->setAttributes(*context.scope, member->attributes);
            field->randMode = randMode;

            if (randMode != RandMode::None)
                field->getDeclaredType()->addFlags(DeclaredTypeFlags::Rand);

            result->addMember(*field);
            fields.push_back(field);

            bitOffset += field->getType().getSelectableWidth();
            bitstreamWidth += field->getType().getBitstreamWidth();
            if (bitOffset > MaxBitWidth || bitstreamWidth > MaxBitWidth) {
                context.addDiag(diag::ObjectTooLarge, syntax.sourceRange());
                return comp.getErrorType();
            }
        }
    }

    result->selectableWidth = bitOffset;
    result->bitstreamWidth = bitstreamWidth;
    result->fields = fields.copy(comp);
    for (auto field : result->fields) {
        // Force resolution of the initializer right away, otherwise nothing
        // is required to force it later.
        field->getInitializer();
    }

    result->setSyntax(syntax);
    return *result;
}